

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

RegSlot __thiscall
ByteCodeGenerator::PrependLocalScopes
          (ByteCodeGenerator *this,RegSlot evalEnv,RegSlot tempLoc,FuncInfo *funcInfo)

{
  uint uVar1;
  Scope *pSVar2;
  Scope *pSVar3;
  RegSlot tmpReg;
  RegSlot RVar4;
  Scope *pSVar5;
  Scope *pSVar6;
  ByteCodeWriter *this_00;
  
  pSVar2 = this->currentScope;
  pSVar5 = funcInfo->currentChildScope;
  if (pSVar5 == (Scope *)0x0) {
    pSVar5 = funcInfo->bodyScope;
  }
  if (pSVar2 != pSVar5) {
    tmpReg = tempLoc;
    if (tempLoc == 0xffffffff) {
      tmpReg = FuncInfo::AcquireTmpRegister(funcInfo);
    }
    this_00 = &this->m_writer;
    while (pSVar3 = pSVar2, pSVar2 != pSVar5) {
      do {
        pSVar6 = pSVar3;
        pSVar3 = pSVar6->enclosingScope;
      } while (pSVar6->enclosingScope != pSVar5);
      pSVar5 = pSVar6;
      if ((pSVar6->field_0x44 & 0x10) != 0) {
        uVar1 = pSVar6->innerScopeIndex;
        RVar4 = FuncInfo::GetEnvRegister(funcInfo);
        if (uVar1 == 0xffffffff) {
          if ((evalEnv == RVar4) || (evalEnv == funcInfo->frameDisplayRegister)) {
            Js::ByteCodeWriter::Reg2(this_00,LdInnerFrameDisplayNoParent,tmpReg,pSVar6->location);
            evalEnv = tmpReg;
          }
          else {
            Js::ByteCodeWriter::Reg3(this_00,LdInnerFrameDisplay,tmpReg,pSVar6->location,evalEnv);
            evalEnv = tmpReg;
          }
        }
        else if ((evalEnv == RVar4) || (evalEnv == funcInfo->frameDisplayRegister)) {
          Js::ByteCodeWriter::Reg1Unsigned1
                    (this_00,LdIndexedFrameDisplayNoParent,tmpReg,pSVar6->innerScopeIndex);
          evalEnv = tmpReg;
        }
        else {
          Js::ByteCodeWriter::Reg2Int1
                    (this_00,LdIndexedFrameDisplay,tmpReg,evalEnv,pSVar6->innerScopeIndex);
          evalEnv = tmpReg;
        }
      }
    }
    if (tempLoc == 0xffffffff) {
      FuncInfo::ReleaseTmpRegister(funcInfo,tmpReg);
    }
  }
  return evalEnv;
}

Assistant:

Js::RegSlot ByteCodeGenerator::PrependLocalScopes(Js::RegSlot evalEnv, Js::RegSlot tempLoc, FuncInfo *funcInfo)
{
    Scope *currScope = this->currentScope;
    Scope *funcScope = funcInfo->GetCurrentChildScope() ? funcInfo->GetCurrentChildScope() : funcInfo->GetBodyScope();

    if (currScope == funcScope)
    {
        return evalEnv;
    }

    bool acquireTempLoc = tempLoc == Js::Constants::NoRegister;
    if (acquireTempLoc)
    {
        tempLoc = funcInfo->AcquireTmpRegister();
    }

    // The with/catch objects must be prepended to the environment we pass to eval() or to a func declared inside with,
    // but the list must first be reversed so that innermost scopes appear first in the list.
    while (currScope != funcScope)
    {
        Scope *innerScope;
        for (innerScope = currScope; innerScope->GetEnclosingScope() != funcScope; innerScope = innerScope->GetEnclosingScope())
            ;
        if (innerScope->GetMustInstantiate())
        {
            if (!innerScope->HasInnerScopeIndex())
            {
                if (evalEnv == funcInfo->GetEnvRegister() || evalEnv == funcInfo->frameDisplayRegister)
                {
                    this->m_writer.Reg2(Js::OpCode::LdInnerFrameDisplayNoParent, tempLoc, innerScope->GetLocation());
                }
                else
                {
                    this->m_writer.Reg3(Js::OpCode::LdInnerFrameDisplay, tempLoc, innerScope->GetLocation(), evalEnv);
                }
            }
            else
            {
                if (evalEnv == funcInfo->GetEnvRegister() || evalEnv == funcInfo->frameDisplayRegister)
                {
                    this->m_writer.Reg1Unsigned1(Js::OpCode::LdIndexedFrameDisplayNoParent, tempLoc, innerScope->GetInnerScopeIndex());
                }
                else
                {
                    this->m_writer.Reg2Int1(Js::OpCode::LdIndexedFrameDisplay, tempLoc, evalEnv, innerScope->GetInnerScopeIndex());
                }
            }
            evalEnv = tempLoc;
        }
        funcScope = innerScope;
    }

    if (acquireTempLoc)
    {
        funcInfo->ReleaseTmpRegister(tempLoc);
    }
    return evalEnv;
}